

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O1

void __thiscall FuncInfo::SetHasMaybeEscapedNestedFunc(FuncInfo *this,char16 *reason)

{
  ParseableFunctionInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  char16 *r;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  sourceContextId =
       Js::FunctionProxy::GetSourceContextId(&this->byteCodeFunction->super_FunctionProxy);
  pPVar1 = this->byteCodeFunction;
  if ((pPVar1->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015d3490,StackFuncPhase,sourceContextId,
                     ((pPVar1->super_FunctionProxy).functionInfo.ptr)->functionId);
  if ((bVar3) && ((this->field_0xb5 & 0x20) == 0)) {
    iVar4 = (*(this->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar6 = Js::FunctionProxy::GetDebugNumberSet
                       (&this->byteCodeFunction->super_FunctionProxy,(wchar (*) [42])local_88);
    Output::Print(L"HasMaybeEscapedNestedFunc (%s): %s (function %s)\n",reason,
                  CONCAT44(extraout_var,iVar4),pcVar6);
    Output::Flush();
  }
  this->field_0xb5 = this->field_0xb5 | 0x20;
  return;
}

Assistant:

void FuncInfo::SetHasMaybeEscapedNestedFunc(DebugOnly(char16 const * reason))
{
    if (PHASE_TESTTRACE(Js::StackFuncPhase, this->byteCodeFunction) && !hasEscapedUseNestedFunc)
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 const * r = _u("");

        DebugOnly(r = reason);
        Output::Print(_u("HasMaybeEscapedNestedFunc (%s): %s (function %s)\n"),
            r,
            this->byteCodeFunction->GetDisplayName(),
            this->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        Output::Flush();
    }
    hasEscapedUseNestedFunc = true;
}